

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O0

FT_Error ft_bitmap_glyph_copy(FT_Glyph bitmap_source,FT_Glyph bitmap_target)

{
  FT_Library library_00;
  FT_Error FVar1;
  FT_BitmapGlyph target;
  FT_BitmapGlyph source;
  FT_Library library;
  FT_Glyph bitmap_target_local;
  FT_Glyph bitmap_source_local;
  
  library_00 = bitmap_source->library;
  *(undefined4 *)&bitmap_target[1].library = *(undefined4 *)&bitmap_source[1].library;
  *(undefined4 *)((long)&bitmap_target[1].library + 4) =
       *(undefined4 *)((long)&bitmap_source[1].library + 4);
  FVar1 = FT_Bitmap_Copy(library_00,(FT_Bitmap *)&bitmap_source[1].clazz,
                         (FT_Bitmap *)&bitmap_target[1].clazz);
  return FVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_bitmap_glyph_copy( FT_Glyph  bitmap_source,
                        FT_Glyph  bitmap_target )
  {
    FT_Library      library = bitmap_source->library;
    FT_BitmapGlyph  source  = (FT_BitmapGlyph)bitmap_source;
    FT_BitmapGlyph  target  = (FT_BitmapGlyph)bitmap_target;


    target->left = source->left;
    target->top  = source->top;

    return FT_Bitmap_Copy( library, &source->bitmap, &target->bitmap );
  }